

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void apply_ctype(dmr_C *C,position pos,ctype *thistype,ctype *ctype)

{
  position local_20;
  position pos_local;
  
  local_20 = pos;
  if (thistype->modifiers != 0) {
    apply_qualifier(C,&local_20,ctype,thistype->modifiers);
  }
  ptrlist_concat((ptr_list *)thistype->contexts,(ptr_list **)&ctype->contexts);
  if (ctype->alignment < thistype->alignment) {
    ctype->alignment = thistype->alignment;
  }
  if (thistype->as != 0) {
    ctype->as = thistype->as;
  }
  return;
}

Assistant:

static void apply_ctype(struct dmr_C *C, struct position pos, struct ctype *thistype, struct ctype *ctype)
{
	unsigned long mod = thistype->modifiers;

	if (mod)
		apply_qualifier(C, &pos, ctype, mod);

	/* Context */
	dmrC_concat_context_list(thistype->contexts, &ctype->contexts);

	/* Alignment */
	if (thistype->alignment > ctype->alignment)
		ctype->alignment = thistype->alignment;

	/* Address space */
	if (thistype->as)
		ctype->as = thistype->as;
}